

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined *puVar1;
  undefined **ppuVar2;
  ostream *poVar3;
  CLI params;
  undefined1 local_71;
  MessageHolder *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [32];
  CLI local_40;
  
  CLI::CLI((CLI *)(local_60 + 0x20),argc,argv);
  if (local_40.speaker == Whale) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010bbb8;
    puVar1 = &Whale::vtable;
  }
  else {
    if (local_40.speaker != Cow) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      this_00->_M_use_count = 1;
      this_00->_M_weak_count = 1;
      this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010bc08;
      ppuVar2 = &PTR_Say_abi_cxx11__0010bc58;
      goto LAB_001046f2;
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010bb30;
    puVar1 = &Cow::vtable;
  }
  ppuVar2 = (undefined **)(puVar1 + 0x10);
LAB_001046f2:
  this_00[1]._vptr__Sp_counted_base = (_func_int **)ppuVar2;
  local_70 = (MessageHolder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MessageHolder,std::allocator<MessageHolder>,std::__cxx11::string&>
            (&local_68,&local_70,(allocator<MessageHolder> *)&local_71,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_60 + 0x20))
  ;
  this._M_pi = local_68._M_pi;
  local_60._16_8_ = local_70;
  local_60._24_8_ = local_68._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  (**this_00[1]._vptr__Sp_counted_base)(&local_70,this_00 + 1,local_60 + 0x10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_70,(long)local_68._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_70 != (MessageHolder *)local_60) {
    operator_delete(local_70,local_60._0_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_);
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.message._M_dataplus._M_p != &local_40.message.field_2) {
    operator_delete(local_40.message._M_dataplus._M_p,
                    local_40.message.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Parse cli parameters
    CLI params(argc, argv);

    // Populate messenger dependency
    std::shared_ptr<ISpeak> messenger;
    switch(params.speaker)
    {
    case Animal::Cow:
        messenger = make_shared<Cow>();
        break;
    case Animal::Whale:
        messenger = make_shared<Whale>();
        break;
    default:
        messenger = make_shared<DefaultMessenger>();
    }

	// Populate message dependency
    shared_ptr<IMessageHolder> message = make_shared<MessageHolder>(params.message);

    // Do Stuff
    cout << messenger->Say(message) << endl;
}